

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O1

void aros_writeexec(GlobalVars *gv,FILE *f)

{
  node *pnVar1;
  
  for (pnVar1 = (gv->lnksec).first; pnVar1->next != (node *)0x0; pnVar1 = pnVar1->next) {
    if (((ulong)pnVar1[2].next & 0x200) == 0) {
      pnVar1[5].pred = pnVar1[5].next;
    }
  }
  elf32_writeobject(gv,f,3,'\0',i386_reloc_vlink2elf);
  return;
}

Assistant:

static void aros_writeexec(struct GlobalVars *gv,FILE *f)
/* creates a target-elfaros executable file, which in reality */
/* is a relocatable object too, but all symbol references have */
/* been resolved */
{
  struct LinkedSection *ls;

  for (ls=(struct LinkedSection *)gv->lnksec.first; ls->n.next!=NULL;
       ls=(struct LinkedSection *)ls->n.next) {
    /* set filesize to memsize for all sections */
    if (!(ls->flags & SF_UNINITIALIZED))
      ls->filesize = ls->size;
  }

  elf32_writeobject(gv,f,EM_386,_LITTLE_ENDIAN_,i386_reloc_vlink2elf);
}